

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* load(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       *__return_storage_ptr__,istream *in,int col_offset)

{
  iterator __position;
  iterator __position_00;
  double dVar1;
  char *__nptr;
  char cVar2;
  istream *piVar3;
  int *piVar4;
  undefined8 uVar5;
  int iVar6;
  pointer pvVar7;
  string token;
  string line;
  istringstream lin;
  char *local_210;
  undefined8 local_208;
  char local_200 [16];
  istream *local_1f0;
  pointer local_1e8;
  double local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined8 local_1c8;
  char local_1c0 [16];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d0 = local_1c0;
  local_1c8 = 0;
  local_1c0[0] = '\0';
  local_1f0 = in;
  do {
    do {
      cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)in + -0x18) + (char)in);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (in,(string *)&local_1d0,cVar2);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
        if (local_1d0 != local_1c0) {
          operator_delete(local_1d0);
        }
        return __return_storage_ptr__;
      }
    } while (*local_1d0 == '%');
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::_M_realloc_insert<>(__return_storage_ptr__,__position);
      pvVar7 = (__return_storage_ptr__->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      ((__position._M_current)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ((__position._M_current)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ((__position._M_current)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar7 = (__return_storage_ptr__->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish + 1;
      (__return_storage_ptr__->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pvVar7;
    }
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_1d0,_S_in);
    local_1e8 = pvVar7 + -1;
    local_210 = local_200;
    local_208 = 0;
    local_200[0] = '\0';
    iVar6 = col_offset;
    if (0 < col_offset) {
      do {
        std::operator>>((istream *)local_1b0,(string *)&local_210);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    while (piVar3 = std::operator>>((istream *)local_1b0,(string *)&local_210), __nptr = local_210,
          ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
      piVar4 = __errno_location();
      iVar6 = *piVar4;
      *piVar4 = 0;
      dVar1 = strtod(__nptr,&local_1d8);
      if (local_1d8 == __nptr) {
        std::__throw_invalid_argument("stod");
LAB_00103c84:
        uVar5 = std::__throw_out_of_range("stod");
        if (local_1d0 != local_1c0) {
          operator_delete(local_1d0);
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(__return_storage_ptr__);
        _Unwind_Resume(uVar5);
      }
      if (*piVar4 == 0) {
        *piVar4 = iVar6;
      }
      else if (*piVar4 == 0x22) goto LAB_00103c84;
      __position_00._M_current =
           pvVar7[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_1e0 = dVar1;
      if (__position_00._M_current ==
          pvVar7[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_1e8,__position_00,&local_1e0);
      }
      else {
        *__position_00._M_current = dVar1;
        pvVar7[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
    }
    if (local_210 != local_200) {
      operator_delete(local_210);
    }
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
    in = local_1f0;
  } while( true );
}

Assistant:

std::vector<Container> load(std::istream& in, int col_offset)
{
    std::vector<Container> points;
    std::string line;
    while (std::getline(in, line))
    {
        if (line[0] == '%')
            continue;
        points.emplace_back();
        auto& point = points.back();
        std::istringstream lin(line);
        std::string token;
        for (int i = 0; i < col_offset; i++)
            lin >> token;
        while (lin >> token)
            point.push_back(std::stod(token));
    }
    return points;
}